

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

SCC * __thiscall google::protobuf::compiler::cpp::SCCAnalyzer::CreateSCC(SCCAnalyzer *this)

{
  SCC *local_18;
  
  local_18 = (SCC *)operator_new(0x18);
  (local_18->descriptors).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->descriptors).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->descriptors).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<google::protobuf::compiler::cpp::SCC*,std::allocator<google::protobuf::compiler::cpp::SCC*>>
  ::emplace_back<google::protobuf::compiler::cpp::SCC*>
            ((vector<google::protobuf::compiler::cpp::SCC*,std::allocator<google::protobuf::compiler::cpp::SCC*>>
              *)&this->garbage_bin_,&local_18);
  return (this->garbage_bin_).
         super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

SCC* CreateSCC() {
    garbage_bin_.push_back(new SCC());
    return garbage_bin_.back();
  }